

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

bool __thiscall cmCTestHG::UpdateImpl(cmCTestHG *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ulong uVar3;
  reference cmd;
  undefined1 auVar4 [16];
  undefined1 local_248 [8];
  OutputLogger err;
  OutputLogger out;
  value_type local_1c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  const_iterator ai;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_180;
  string local_160;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  string opts;
  char *local_f0;
  value_type local_e8;
  undefined1 local_e0 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> hg_update;
  undefined1 local_b8 [8];
  OutputLogger err_1;
  OutputLogger out_1;
  char *hg_pull [4];
  char *hg;
  cmCTestHG *this_local;
  
  out_1.super_LineParser._56_8_ = std::__cxx11::string::c_str();
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&err_1.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_b8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-err> "
            );
  cmCTestVC::RunChild((cmCTestVC *)this,(char **)&out_1.super_LineParser.Separator,
                      (OutputParser *)&err_1.super_LineParser.Separator,(OutputParser *)local_b8,
                      (char *)0x0,Auto);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_b8);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&err_1.super_LineParser.Separator);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0);
  local_e8 = (value_type)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,&local_e8);
  local_f0 = "update";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,&local_f0);
  opts.field_2._8_8_ = anon_var_dwarf_1422e9;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,
             (value_type *)((long)&opts.field_2 + 8));
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"UpdateOptions",&local_139);
  cmCTest::GetCTestConfiguration((string *)local_118,pcVar1,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_180,"HGUpdateOptions",
               (allocator *)
               ((long)&args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmCTest::GetCTestConfiguration(&local_160,pcVar1,&local_180);
    std::__cxx11::string::operator=((string *)local_118,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  auVar4 = std::__cxx11::string::c_str();
  cmSystemTools::ParseArguments_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ai,auVar4._0_8_,auVar4._8_8_);
  local_1b0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ai);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_1a8,&local_1b0);
  while( true ) {
    local_1b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ai);
    bVar2 = __gnu_cxx::operator!=(&local_1a8,&local_1b8);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_1a8);
    local_1c0 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,&local_1c0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1a8);
  }
  out.super_LineParser.Separator = '\0';
  out.super_LineParser.LineEnd = '\0';
  out.super_LineParser.IgnoreCR = false;
  out.super_LineParser._59_5_ = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,
             (value_type *)&out.super_LineParser.Separator);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&err.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"update-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_248,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "update-err> ");
  cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0,0);
  bVar2 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,cmd,(OutputParser *)&err.super_LineParser.Separator,
                     (OutputParser *)local_248,Auto);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_248);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&err.super_LineParser.Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ai);
  std::__cxx11::string::~string((string *)local_118);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_e0);
  return bVar2;
}

Assistant:

bool cmCTestHG::UpdateImpl()
{
  // Use "hg pull" followed by "hg update" to update the working tree.
  {
    const char* hg = this->CommandLineTool.c_str();
    const char* hg_pull[] = { hg, "pull", "-v", CM_NULLPTR };
    OutputLogger out(this->Log, "pull-out> ");
    OutputLogger err(this->Log, "pull-err> ");
    this->RunChild(&hg_pull[0], &out, &err);
  }

  // TODO: if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)

  std::vector<char const*> hg_update;
  hg_update.push_back(this->CommandLineTool.c_str());
  hg_update.push_back("update");
  hg_update.push_back("-v");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("HGUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts.c_str());
  for (std::vector<std::string>::const_iterator ai = args.begin();
       ai != args.end(); ++ai) {
    hg_update.push_back(ai->c_str());
  }

  // Sentinel argument.
  hg_update.push_back(CM_NULLPTR);

  OutputLogger out(this->Log, "update-out> ");
  OutputLogger err(this->Log, "update-err> ");
  return this->RunUpdateCommand(&hg_update[0], &out, &err);
}